

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::MultiplyPropagateStatistics::Operation<signed_char,duckdb::TryMultiplyOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  ushort uVar7;
  bool bVar8;
  ushort uVar9;
  bool bVar10;
  char cVar11;
  ushort uVar12;
  Value local_70;
  
  cVar2 = NumericStats::GetMin<signed_char>(lstats);
  cVar3 = NumericStats::GetMax<signed_char>(lstats);
  cVar4 = NumericStats::GetMin<signed_char>(rstats);
  cVar5 = NumericStats::GetMax<signed_char>(rstats);
  uVar7 = 0x7f;
  uVar9 = 0x80;
  bVar1 = true;
  do {
    bVar8 = bVar1;
    cVar11 = cVar4;
    bVar1 = true;
    do {
      bVar10 = bVar1;
      uVar12 = (short)cVar11 * (short)cVar2;
      cVar11 = (char)uVar12;
      if ((short)cVar11 != uVar12) goto LAB_009ae85f;
      cVar6 = (char)uVar7;
      uVar7 = uVar7 & 0xff;
      if (cVar11 <= cVar6) {
        uVar7 = uVar12;
      }
      cVar6 = (char)uVar9;
      uVar9 = uVar9 & 0xff;
      if (cVar6 <= cVar11) {
        uVar9 = uVar12;
      }
      cVar11 = cVar5;
      bVar1 = false;
    } while (bVar10);
    cVar2 = cVar3;
    bVar1 = false;
  } while (bVar8);
  Value::Numeric(&local_70,type,(long)(char)uVar7);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)(char)uVar9);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
LAB_009ae85f:
  return (ushort)(uVar12 - 0x80) < 0xff00;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}